

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O2

void __thiscall wasm::ReReloop::~ReReloop(ReReloop *this)

{
  ~ReReloop(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }